

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddEdgeToSEL(Clipper *this,TEdge *edge)

{
  TEdge *pTVar1;
  
  pTVar1 = this->m_SortedEdges;
  edge->PrevInSEL = (TEdge *)0x0;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->PrevInSEL = edge;
  }
  this->m_SortedEdges = edge;
  edge->NextInSEL = pTVar1;
  return;
}

Assistant:

void Clipper::AddEdgeToSEL(TEdge *edge)
{
  //SEL pointers in PEdge are reused to build a list of horizontal edges.
  //However, we don't need to worry about order with horizontal edge processing.
  if( !m_SortedEdges )
  {
    m_SortedEdges = edge;
    edge->PrevInSEL = 0;
    edge->NextInSEL = 0;
  }
  else
  {
    edge->NextInSEL = m_SortedEdges;
    edge->PrevInSEL = 0;
    m_SortedEdges->PrevInSEL = edge;
    m_SortedEdges = edge;
  }
}